

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# batched_buffered_data.cpp
# Opt level: O2

void __thiscall
duckdb::BatchedBufferedData::MoveCompletedBatches
          (BatchedBufferedData *this,lock_guard<std::mutex> *lock)

{
  unsigned_long params;
  unsigned_long params_1;
  map<unsigned_long,_duckdb::InProgressBatch,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::InProgressBatch>_>_>
  *this_00;
  pointer this_01;
  idx_t iVar1;
  _Base_ptr p_Var2;
  _Elt_pointer puVar3;
  InternalException *this_02;
  size_type params_2;
  unsigned_long params_3;
  unsigned_long batch_index;
  value_type batch_index_1;
  _Rb_tree_color local_c8;
  undefined4 uStack_c4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_c0;
  map<unsigned_long,_duckdb::InProgressBatch,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::InProgressBatch>_>_>
  *local_b0;
  _Rb_tree_node_base *local_a8;
  type chunk;
  stack<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_> to_remove;
  
  ::std::stack<unsigned_long,std::deque<unsigned_long,std::allocator<unsigned_long>>>::
  stack<std::deque<unsigned_long,std::allocator<unsigned_long>>,void>(&to_remove);
  local_b0 = &this->buffer;
  p_Var2 = (this->buffer)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_a8 = &(this->buffer)._M_t._M_impl.super__Rb_tree_header._M_header;
  while( true ) {
    this_00 = local_b0;
    if ((p_Var2 == local_a8) ||
       (batch_index = *(unsigned_long *)(p_Var2 + 1), this->min_batch < batch_index)) {
      while (to_remove.c.super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Deque_impl_data._M_finish._M_cur !=
             to_remove.c.super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Deque_impl_data._M_start._M_cur) {
        puVar3 = to_remove.c.super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>.
                 _M_impl.super__Deque_impl_data._M_finish._M_cur;
        if (to_remove.c.super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Deque_impl_data._M_finish._M_cur ==
            to_remove.c.super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Deque_impl_data._M_finish._M_first) {
          puVar3 = to_remove.c.super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
        }
        batch_index_1 = puVar3[-1];
        ::std::deque<unsigned_long,_std::allocator<unsigned_long>_>::pop_back(&to_remove.c);
        ::std::
        _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_duckdb::InProgressBatch>,_std::_Select1st<std::pair<const_unsigned_long,_duckdb::InProgressBatch>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::InProgressBatch>_>_>
        ::erase(&this_00->_M_t,&batch_index_1);
      }
      ::std::_Deque_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Deque_base
                ((_Deque_base<unsigned_long,_std::allocator<unsigned_long>_> *)&to_remove);
      return;
    }
    batch_index_1 = (value_type)p_Var2[1]._M_right;
    local_c8 = p_Var2[2]._M_color;
    uStack_c4 = *(undefined4 *)&p_Var2[2].field_0x4;
    aStack_c0._M_allocated_capacity._0_4_ = *(undefined4 *)&p_Var2[2]._M_parent;
    aStack_c0._M_allocated_capacity._4_4_ = *(undefined4 *)((long)&p_Var2[2]._M_parent + 4);
    aStack_c0._8_8_ = p_Var2[2]._M_left;
    params_3 = 0;
    while ((_Base_ptr)batch_index_1 != p_Var2[2]._M_right) {
      chunk.super_unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>_>._M_t.
      super___uniq_ptr_impl<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::DataChunk_*,_std::default_delete<duckdb::DataChunk>_>.
      super__Head_base<0UL,_duckdb::DataChunk_*,_false>._M_head_impl =
           *(unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>_> *)batch_index_1;
      *(undefined8 *)batch_index_1 = 0;
      this_01 = unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>::
                operator->((unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>
                            *)&chunk);
      iVar1 = DataChunk::GetAllocationSize(this_01);
      ::std::
      deque<duckdb::unique_ptr<duckdb::DataChunk,std::default_delete<duckdb::DataChunk>,true>,std::allocator<duckdb::unique_ptr<duckdb::DataChunk,std::default_delete<duckdb::DataChunk>,true>>>
      ::
      emplace_back<duckdb::unique_ptr<duckdb::DataChunk,std::default_delete<duckdb::DataChunk>,true>>
                ((deque<duckdb::unique_ptr<duckdb::DataChunk,std::default_delete<duckdb::DataChunk>,true>,std::allocator<duckdb::unique_ptr<duckdb::DataChunk,std::default_delete<duckdb::DataChunk>,true>>>
                  *)&this->read_queue,
                 (unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true> *)
                 &chunk);
      params_3 = params_3 + iVar1;
      ::std::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>_>::~unique_ptr
                ((unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>_> *)&chunk);
      ::std::
      _Deque_iterator<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>,_duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>_&,_duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>_*>
      ::operator++((_Self *)&chunk,
                   (_Deque_iterator<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>,_duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>_&,_duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>_*>
                    *)&batch_index_1,0);
    }
    if (batch_index < this->lowest_moved_batch) break;
    this->lowest_moved_batch = batch_index;
    LOCK();
    (this->buffer_byte_count).super___atomic_base<unsigned_long>._M_i =
         (this->buffer_byte_count).super___atomic_base<unsigned_long>._M_i - params_3;
    UNLOCK();
    LOCK();
    (this->read_queue_byte_count).super___atomic_base<unsigned_long>._M_i =
         (this->read_queue_byte_count).super___atomic_base<unsigned_long>._M_i + params_3;
    UNLOCK();
    ::std::deque<unsigned_long,_std::allocator<unsigned_long>_>::push_back
              (&to_remove.c,&batch_index);
    p_Var2 = (_Base_ptr)::std::_Rb_tree_increment(p_Var2);
  }
  this_02 = (InternalException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&batch_index_1,
             "Lowest moved batch is %d, attempted to move %d afterwards\nAttempted to move %d chunks, of %d bytes in total\nmin_batch is %d"
             ,(allocator *)&chunk);
  params_1 = batch_index;
  params = this->lowest_moved_batch;
  params_2 = ::std::
             deque<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>_>_>
             ::size((deque<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>_>_>
                     *)&p_Var2[1]._M_parent);
  InternalException::
  InternalException<unsigned_long,unsigned_long,unsigned_long,unsigned_long,unsigned_long>
            (this_02,(string *)&batch_index_1,params,params_1,params_2,params_3,this->min_batch);
  __cxa_throw(this_02,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void BatchedBufferedData::MoveCompletedBatches(lock_guard<mutex> &lock) {
	stack<idx_t> to_remove;
	for (auto &it : buffer) {
		auto batch_index = it.first;
		auto &in_progress_batch = it.second;
		if (batch_index > min_batch) {
			break;
		}
		D_ASSERT(in_progress_batch.completed || batch_index == min_batch);
		// min_batch - took longer than others
		// min_batch+1 - completed before min_batch
		// min_batch+2 - completed before min_batch
		// new min_batch
		//
		// To preserve the order, the completed batches have to be processed before we can start scanning the "new
		// min_batch"
		auto &chunks = in_progress_batch.chunks;

		idx_t batch_allocation_size = 0;
		for (auto it = chunks.begin(); it != chunks.end(); it++) {
			auto chunk = std::move(*it);
			auto allocation_size = chunk->GetAllocationSize();
			batch_allocation_size += allocation_size;
			read_queue.push_back(std::move(chunk));
		}
		// Verification to make sure we're not breaking the order by moving batches before the previous ones have
		// finished
		if (lowest_moved_batch > batch_index) {
			throw InternalException("Lowest moved batch is %d, attempted to move %d afterwards\nAttempted to move %d "
			                        "chunks, of %d bytes in total\nmin_batch is %d",
			                        lowest_moved_batch, batch_index, chunks.size(), batch_allocation_size, min_batch);
		}
		D_ASSERT(lowest_moved_batch <= batch_index);
		lowest_moved_batch = batch_index;

		buffer_byte_count -= batch_allocation_size;
		read_queue_byte_count += batch_allocation_size;
		to_remove.push(batch_index);
	}
	while (!to_remove.empty()) {
		auto batch_index = to_remove.top();
		to_remove.pop();
		buffer.erase(batch_index);
	}
}